

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O1

int64_t __thiscall google::protobuf::MapKey::GetInt64Value(MapKey *this)

{
  CppType CVar1;
  LogMessage *this_00;
  LogMessageFatal aLStack_38 [16];
  char *local_28;
  char *local_20;
  
  CVar1 = type(this);
  if (CVar1 == CPPTYPE_INT64) {
    return (this->val_).int64_value;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (aLStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/map_field.h"
             ,0x79);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_38,0x21,"Protocol Buffer map usage error:\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_38,0x15,"MapKey::GetInt64Value");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_38,0x15," type does not match\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (aLStack_38,0xd,"  Expected : ");
  local_20 = (char *)0x346d18;
  this_00 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                      ((LogMessage *)aLStack_38,&local_20);
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>(this_00,1,"\n");
  absl::lts_20240722::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
            (this_00,0xd,"  Actual   : ");
  CVar1 = type(this);
  local_28 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8);
  absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>(this_00,&local_28);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_38);
}

Assistant:

int64_t GetInt64Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_INT64, "MapKey::GetInt64Value");
    return val_.int64_value;
  }